

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svsetbase.h
# Opt level: O2

void __thiscall soplex::SVSetBase<double>::SVSetBase(SVSetBase<double> *this,SVSetBase<double> *old)

{
  int iVar1;
  
  ClassArray<soplex::Nonzero<double>_>::ClassArray
            (&this->super_ClassArray<soplex::Nonzero<double>_>,0,0,1.2);
  (this->super_ClassArray<soplex::Nonzero<double>_>)._vptr_ClassArray =
       (_func_int **)&PTR__SVSetBase_003334a0;
  ClassSet<soplex::SVSetBase<double>::DLPSV>::ClassSet(&this->set,8);
  (this->list).super_IsList<soplex::SVSetBase<double>::DLPSV>.the_first = (DLPSV *)0x0;
  (this->list).super_IsList<soplex::SVSetBase<double>::DLPSV>.the_last = (DLPSV *)0x0;
  (this->list).super_IsList<soplex::SVSetBase<double>::DLPSV>.destroyElements = false;
  iVar1 = old->numUnusedMemUpdates;
  this->unusedMem = old->unusedMem;
  this->numUnusedMemUpdates = iVar1;
  this->factor = old->factor;
  operator=(this,old);
  return;
}

Assistant:

SVSetBase(const SVSetBase<R>& old)
      : SVSetBaseArray()
      , unusedMem(old.unusedMem)
      , numUnusedMemUpdates(old.numUnusedMemUpdates)
      , factor(old.factor)
   {
      *this = old;

      assert(SVSetBase::isConsistent());
   }